

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record_file.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  uint errorCode;
  ring_buffer_size_t rVar1;
  PaDeviceInfo *pPVar2;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  size_t sStackY_e0;
  PaStream *stream;
  paTestData data;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  
  data.ringBuffer.buffer = (char *)0x0;
  data.file = (FILE *)0x0;
  data.ringBuffer.smallMask = 0;
  data.ringBuffer.elementSizeBytes = 0;
  data.ringBuffer.readIndex = 0;
  data.ringBuffer.bigMask = 0;
  data.ringBuffer.bufferSize = 0;
  data.ringBuffer.writeIndex = 0;
  data.frameIndex = 0;
  data.threadSyncFlag = 0;
  data.ringBufferData = (SAMPLE *)0x0;
  data.threadHandle = (void *)0x0;
  puts("patest_record.c");
  fflush(_stdout);
  data.ringBufferData = (SAMPLE *)PaUtil_AllocateMemory(0x40000);
  if (data.ringBufferData == (SAMPLE *)0x0) {
    pcVar3 = "Could not allocate ring buffer data.";
LAB_00106b7a:
    puts(pcVar3);
  }
  else {
    rVar1 = PaUtil_InitializeRingBuffer(&data.ringBuffer,4,0x10000,data.ringBufferData);
    if (rVar1 < 0) {
      pcVar3 = "Failed to initialize ring buffer. Size is not power of 2 ??";
      goto LAB_00106b7a;
    }
    errorCode = Pa_Initialize();
    if (errorCode != 0) goto LAB_00106b81;
    inputParameters.device = Pa_GetDefaultInputDevice();
    if (inputParameters.device == -1) {
      pcVar3 = "Error: No default input device.\n";
      sStackY_e0 = 0x20;
LAB_00106ccd:
      fwrite(pcVar3,sStackY_e0,1,_stderr);
    }
    else {
      inputParameters.channelCount = 2;
      inputParameters.sampleFormat = 1;
      pPVar2 = Pa_GetDeviceInfo(inputParameters.device);
      inputParameters.suggestedLatency = pPVar2->defaultLowInputLatency;
      inputParameters.hostApiSpecificStreamInfo = (void *)0x0;
      errorCode = Pa_OpenStream(&stream,&inputParameters,(PaStreamParameters *)0x0,44100.0,0x200,1,
                                recordCallback,&data);
      if (errorCode != 0) goto LAB_00106b81;
      pcVar3 = "wb";
      data.file = (FILE *)fopen("audio_data.raw","wb");
      errorCode = 0;
      if ((FILE *)data.file == (FILE *)0x0) goto LAB_00106b81;
      startThread(&data,(ThreadFunctionType)pcVar3);
      errorCode = Pa_StartStream(stream);
      if (errorCode != 0) goto LAB_00106b81;
      iVar4 = 10;
      printf(
            "\n=== Now recording to \'audio_data.raw\' for %d seconds!! Please speak into the microphone. ===\n"
            );
      fflush(_stdout);
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        printf("index = %d\n");
        fflush(_stdout);
        Pa_Sleep(1000);
      }
      errorCode = Pa_CloseStream(stream);
      if (errorCode != 0) goto LAB_00106b81;
      data.threadSyncFlag = 1;
      while (data.threadSyncFlag != 0) {
        Pa_Sleep(10);
      }
      fclose((FILE *)data.file);
      data.file = (FILE *)0x0;
      data._0_8_ = (ulong)(uint)data.threadSyncFlag << 0x20;
      outputParameters.device = Pa_GetDefaultOutputDevice();
      if (outputParameters.device == -1) {
        pcVar3 = "Error: No default output device.\n";
        sStackY_e0 = 0x21;
        goto LAB_00106ccd;
      }
      outputParameters.channelCount = 2;
      outputParameters.sampleFormat = 1;
      pPVar2 = Pa_GetDeviceInfo(outputParameters.device);
      outputParameters.suggestedLatency = pPVar2->defaultLowOutputLatency;
      outputParameters.hostApiSpecificStreamInfo = (void *)0x0;
      puts("\n=== Now playing back from file \'audio_data.raw\' until end-of-file is reached ===");
      fflush(_stdout);
      errorCode = Pa_OpenStream(&stream,(PaStreamParameters *)0x0,&outputParameters,44100.0,0x200,1,
                                playCallback,&data);
      if ((errorCode != 0) || (stream == (PaStream *)0x0)) goto LAB_00106b81;
      pcVar3 = "rb";
      data.file = (FILE *)fopen("audio_data.raw","rb");
      if ((FILE *)data.file != (FILE *)0x0) {
        startThread(&data,(ThreadFunctionType)pcVar3);
        errorCode = Pa_StartStream(stream);
        if (errorCode != 0) goto LAB_00106b81;
        puts("Waiting for playback to finish.");
        fflush(_stdout);
        while (errorCode = Pa_IsStreamActive(stream), errorCode == 1) {
          printf("index = %d\n",data._0_8_ & 0xffffffff);
          fflush(_stdout);
          Pa_Sleep(1000);
        }
        if ((int)errorCode < 0) goto LAB_00106b81;
      }
      errorCode = Pa_CloseStream(stream);
      if (errorCode != 0) goto LAB_00106b81;
      fclose((FILE *)data.file);
      puts("Done.");
      fflush(_stdout);
    }
  }
  errorCode = 0;
LAB_00106b81:
  Pa_Terminate();
  if (data.ringBufferData != (SAMPLE *)0x0) {
    PaUtil_FreeMemory(data.ringBufferData);
  }
  if (errorCode != 0) {
    fwrite("An error occured while using the portaudio stream\n",0x32,1,_stderr);
    fprintf(_stderr,"Error number: %d\n",(ulong)errorCode);
    __stream = _stderr;
    pcVar3 = Pa_GetErrorText(errorCode);
    fprintf(__stream,"Error message: %s\n",pcVar3);
  }
  return (uint)(errorCode != 0);
}

Assistant:

int main(void)
{
    PaStreamParameters  inputParameters,
                        outputParameters;
    PaStream*           stream;
    PaError             err = paNoError;
    paTestData          data = {0};
    unsigned            delayCntr;
    unsigned            numSamples;
    unsigned            numBytes;

    printf("patest_record.c\n"); fflush(stdout);

    /* We set the ring buffer size to about 500 ms */
    numSamples = NextPowerOf2((unsigned)(SAMPLE_RATE * 0.5 * NUM_CHANNELS));
    numBytes = numSamples * sizeof(SAMPLE);
    data.ringBufferData = (SAMPLE *) PaUtil_AllocateMemory( numBytes );
    if( data.ringBufferData == NULL )
    {
        printf("Could not allocate ring buffer data.\n");
        goto done;
    }

    if (PaUtil_InitializeRingBuffer(&data.ringBuffer, sizeof(SAMPLE), numSamples, data.ringBufferData) < 0)
    {
        printf("Failed to initialize ring buffer. Size is not power of 2 ??\n");
        goto done;
    }

    err = Pa_Initialize();
    if( err != paNoError ) goto done;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default input device.\n");
        goto done;
    }
    inputParameters.channelCount = 2;                    /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    /* Record some audio. -------------------------------------------- */
    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              NULL,                  /* &outputParameters, */
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              recordCallback,
              &data );
    if( err != paNoError ) goto done;

    /* Open the raw audio 'cache' file... */
    data.file = fopen(FILE_NAME, "wb");
    if (data.file == 0) goto done;

    /* Start the file writing thread */
    err = startThread(&data, threadFunctionWriteToRawFile);
    if( err != paNoError ) goto done;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto done;
    printf("\n=== Now recording to '" FILE_NAME "' for %d seconds!! Please speak into the microphone. ===\n", NUM_SECONDS); fflush(stdout);

    /* Note that the RECORDING part is limited with TIME, not size of the file and/or buffer, so you can
       increase NUM_SECONDS until you run out of disk */
    delayCntr = 0;
    while( delayCntr++ < NUM_SECONDS )
    {
        printf("index = %d\n", data.frameIndex ); fflush(stdout);
        Pa_Sleep(1000);
    }
    if( err < 0 ) goto done;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto done;

    /* Stop the thread */
    err = stopThread(&data);
    if( err != paNoError ) goto done;

    /* Close file */
    fclose(data.file);
    data.file = 0;

    /* Playback recorded data.  -------------------------------------------- */
    data.frameIndex = 0;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default output device.\n");
        goto done;
    }
    outputParameters.channelCount = 2;                     /* stereo output */
    outputParameters.sampleFormat =  PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    printf("\n=== Now playing back from file '" FILE_NAME "' until end-of-file is reached ===\n"); fflush(stdout);
    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              playCallback,
              &data );
    if( err != paNoError ) goto done;

    if( stream )
    {
        /* Open file again for reading */
        data.file = fopen(FILE_NAME, "rb");
        if (data.file != 0)
        {
            /* Start the file reading thread */
            err = startThread(&data, threadFunctionReadFromRawFile);
            if( err != paNoError ) goto done;

            err = Pa_StartStream( stream );
            if( err != paNoError ) goto done;

            printf("Waiting for playback to finish.\n"); fflush(stdout);

            /* The playback will end when EOF is reached */
            while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) {
                printf("index = %d\n", data.frameIndex ); fflush(stdout);
                Pa_Sleep(1000);
            }
            if( err < 0 ) goto done;
        }
        
        err = Pa_CloseStream( stream );
        if( err != paNoError ) goto done;

        fclose(data.file);
        
        printf("Done.\n"); fflush(stdout);
    }

done:
    Pa_Terminate();
    if( data.ringBufferData )       /* Sure it is NULL or valid. */
        PaUtil_FreeMemory( data.ringBufferData );
    if( err != paNoError )
    {
        fprintf( stderr, "An error occured while using the portaudio stream\n" );
        fprintf( stderr, "Error number: %d\n", err );
        fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
        err = 1;          /* Always return 0 or 1, but no other return codes. */
    }
    return err;
}